

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

bool __thiscall
duckdb::roaring::RoaringAnalyzeState::HasEnoughSpaceInSegment
          (RoaringAnalyzeState *this,idx_t required_space)

{
  BlockManager *pBVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  pBVar1 = (this->super_AnalyzeState).info.block_manager;
  iVar2 = this->metadata_size;
  iVar3 = this->data_size;
  iVar4 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar1->block_header_size);
  return required_space <= iVar4 - (iVar5 + iVar2 + iVar3);
}

Assistant:

bool RoaringAnalyzeState::HasEnoughSpaceInSegment(idx_t required_space) {
	auto space_used = data_size + metadata_size;
	D_ASSERT(space_used <= info.GetBlockSize());
	idx_t remaining_space = info.GetBlockSize() - space_used;
	if (required_space > remaining_space) {
		return false;
	}
	return true;
}